

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

Str tl::toUtf8(CStr32 o)

{
  u32 uVar1;
  byte *pbVar2;
  char32_t *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  byte bVar4;
  int iVar5;
  uint uVar6;
  StrT<char> *this;
  byte bVar7;
  long lVar8;
  byte bVar9;
  CStr32 str;
  Str SVar10;
  
  this = o._0_8_;
  str._str = in_RDX;
  str._0_8_ = in_RDX;
  uVar1 = calcSizeUtf8((tl *)(ulong)(uint)o._str,str);
  StrT<char>::StrT(this,uVar1,'.');
  lVar8 = 0;
  uVar1 = 0;
  uVar3 = extraout_RDX;
  do {
    if (((ulong)o._str & 0xffffffff) << 2 == lVar8) {
      SVar10._8_8_ = uVar3;
      SVar10._str = (char *)this;
      return SVar10;
    }
    uVar6 = *(uint *)((long)in_RDX + lVar8);
    if (uVar6 < 0x80) {
      iVar5 = 1;
LAB_0012753a:
      bVar4 = (byte)uVar6;
    }
    else {
      if (uVar6 < 0x800) {
        pbVar2 = (byte *)StrT<char>::operator[](this,uVar1 + 1);
        *pbVar2 = (byte)uVar6 & 0x3f | 0x80;
        uVar6 = (uint)(byte)((byte)(uVar6 >> 6) | 0xc0);
        iVar5 = 2;
        goto LAB_0012753a;
      }
      bVar9 = (byte)uVar6 & 0x3f | 0x80;
      bVar7 = (byte)(uVar6 >> 6) & 0x3f | 0x80;
      bVar4 = (byte)(uVar6 >> 0xc);
      if (uVar6 < 0x10000) {
        pbVar2 = (byte *)StrT<char>::operator[](this,uVar1 + 2);
        *pbVar2 = bVar9;
        pbVar2 = (byte *)StrT<char>::operator[](this,uVar1 + 1);
        *pbVar2 = bVar7;
        bVar4 = bVar4 | 0xe0;
        iVar5 = 3;
      }
      else {
        pbVar2 = (byte *)StrT<char>::operator[](this,uVar1 + 3);
        *pbVar2 = bVar9;
        pbVar2 = (byte *)StrT<char>::operator[](this,uVar1 + 2);
        *pbVar2 = bVar7;
        pbVar2 = (byte *)StrT<char>::operator[](this,uVar1 + 1);
        *pbVar2 = bVar4 & 0x3f | 0x80;
        bVar4 = (byte)(uVar6 >> 0x12) & 7 | 0xf0;
        iVar5 = 4;
      }
    }
    pbVar2 = (byte *)StrT<char>::operator[](this,uVar1);
    *pbVar2 = bVar4;
    uVar1 = uVar1 + iVar5;
    lVar8 = lVar8 + 4;
    uVar3 = extraout_RDX_00;
  } while( true );
}

Assistant:

Str toUtf8(CStr32 o)
{
    const u32 size = calcSizeUtf8(o);
    Str str(size);
    u32 j = 0;
    for(char32_t c : o) {
        if(c < 0x80) {
            str[j] = c & 0b0111'1111;
            j += 1;
        }
        else if(c < 0x800) {
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1100'0000 | (0b1'1111 & c);
            j += 2;
        }
        else if(c < 0x10000) {
            str[j+2] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1110'0000 | (0b1111 & c);
            j += 3;
        }
        else {
            str[j+3] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+2] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1111'0000 | (0b111 & c);
            j += 4;
        }
    }
    return str;
}